

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowBase.cpp
# Opt level: O0

void __thiscall sf::WindowBase::create(WindowBase *this,WindowHandle handle)

{
  WindowImpl *pWVar1;
  WindowBase *in_RSI;
  long *in_RDI;
  WindowHandle unaff_retaddr;
  
  (**(code **)(*in_RDI + 0x20))();
  pWVar1 = priv::WindowImpl::create(unaff_retaddr);
  in_RDI[1] = (long)pWVar1;
  initialize(in_RSI);
  return;
}

Assistant:

void WindowBase::create(WindowHandle handle)
{
    // Destroy the previous window implementation
    close();

    // Recreate the window implementation
    m_impl = priv::WindowImpl::create(handle);

    // Perform common initializations
    initialize();
}